

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_gradation_at_complexity_mixed
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  REF_NODE pRVar1;
  REF_DBL *metric_00;
  uint uVar2;
  ulong uVar3;
  REF_DBL *pRVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  REF_STATUS ref_private_macro_code_rss;
  char *pcVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  REF_DBL RVar12;
  REF_DBL current_complexity;
  REF_DBL *local_88;
  double local_80;
  REF_DBL local_78;
  REF_DBL RStack_70;
  REF_DBL local_68;
  REF_DBL *local_58;
  REF_DBL local_50;
  double local_48;
  
  pRVar1 = ref_grid->node;
  if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x478,
           "ref_metric_gradation_at_complexity_mixed","malloc metric_imply of REF_DBL negative");
    uVar2 = 1;
  }
  else {
    local_80 = *(double *)(&DAT_00207ce0 + (ulong)(ref_grid->twod == 0) * 8);
    local_48 = complexity;
    if (complexity <= -complexity) {
      local_48 = -complexity;
    }
    local_58 = metric + 4;
    local_78 = 0.0;
    RStack_70 = 1.0;
    local_88 = metric;
    local_68 = complexity;
    local_50 = gradation;
    for (iVar9 = 0; uVar2 = ref_metric_complexity(metric,ref_grid,&current_complexity),
        iVar9 != 0x14; iVar9 = iVar9 + 1) {
      if (uVar2 != 0) {
        pcVar8 = "cmp";
        uVar6 = 0x480;
        goto LAB_001794be;
      }
      dVar11 = current_complexity * 1e+20;
      if (dVar11 <= -dVar11) {
        dVar11 = -dVar11;
      }
      if (dVar11 <= local_48) {
        return 4;
      }
      RVar12 = local_68;
      for (lVar10 = 0; metric_00 = local_88, lVar10 < pRVar1->max; lVar10 = lVar10 + 1) {
        if (-1 < pRVar1->global[lVar10]) {
          for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
            dVar11 = pow(RVar12 / current_complexity,local_80);
            metric[lVar7] = dVar11 * metric[lVar7];
            RVar12 = local_68;
          }
          if (ref_grid->twod != 0) {
            local_88[lVar10 * 6 + 2] = 0.0;
            local_88[lVar10 * 6 + 4] = local_78;
            (local_88 + lVar10 * 6 + 4)[1] = RStack_70;
          }
        }
        metric = metric + 6;
      }
      uVar2 = ref_metric_imply_non_tet(local_88,ref_grid);
      if (uVar2 != 0) {
        pcVar8 = "imply non tet";
        uVar6 = 0x48f;
        goto LAB_001794be;
      }
      if (1.0 <= local_50) {
        uVar2 = ref_metric_metric_space_gradation(metric_00,ref_grid,local_50);
        if (uVar2 != 0) {
          pcVar8 = "gradation";
          uVar6 = 0x495;
          goto LAB_001794be;
        }
      }
      else {
        uVar2 = ref_metric_mixed_space_gradation(metric_00,ref_grid,-1.0,-1.0);
        if (uVar2 != 0) {
          pcVar8 = "gradation";
          uVar6 = 0x492;
          goto LAB_001794be;
        }
      }
      if (ref_grid->twod != 0) {
        uVar3 = (ulong)(uint)pRVar1->max;
        if (pRVar1->max < 1) {
          uVar3 = 0;
        }
        pRVar4 = local_58;
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          if (-1 < pRVar1->global[uVar5]) {
            pRVar4[-2] = 0.0;
            *pRVar4 = local_78;
            pRVar4[1] = RStack_70;
          }
          pRVar4 = pRVar4 + 6;
        }
      }
      metric = metric_00;
    }
    if (uVar2 == 0) {
      dVar11 = current_complexity * 1e+20;
      if (dVar11 <= -dVar11) {
        dVar11 = -dVar11;
      }
      uVar2 = 4;
      if (local_48 < dVar11) {
        local_78 = 0.0;
        RStack_70 = 1.0;
        RVar12 = local_68;
        for (lVar10 = 0; lVar10 < pRVar1->max; lVar10 = lVar10 + 1) {
          if (-1 < pRVar1->global[lVar10]) {
            for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
              dVar11 = pow(RVar12 / current_complexity,local_80);
              metric[lVar7] = dVar11 * metric[lVar7];
              RVar12 = local_68;
            }
            if (ref_grid->twod != 0) {
              local_88[lVar10 * 6 + 2] = 0.0;
              local_88[lVar10 * 6 + 4] = local_78;
              (local_88 + lVar10 * 6 + 4)[1] = RStack_70;
            }
          }
          metric = metric + 6;
        }
        uVar2 = 0;
      }
    }
    else {
      pcVar8 = "cmp";
      uVar6 = 0x49f;
LAB_001794be:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar6,"ref_metric_gradation_at_complexity_mixed",(ulong)uVar2,pcVar8);
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_gradation_at_complexity_mixed(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL gradation, REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;
  REF_DBL *metric_imply;

  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
      if (ref_grid_twod(ref_grid)) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
    RSS(ref_metric_imply_non_tet(metric, ref_grid), "imply non tet");
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
  }
  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  ref_free(metric_imply) return REF_SUCCESS;
}